

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerPoll.cpp
# Opt level: O3

void __thiscall Liby::PollerPoll::PollerPoll(PollerPoll *this)

{
  Poller::Poller(&this->super_Poller);
  (this->super_Poller)._vptr_Poller = (_func_int **)&PTR__PollerPoll_0012db58;
  (this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pollfds_).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pollfd,_std::allocator<pollfd>_>::resize(&this->pollfds_,0x30);
  return;
}

Assistant:

PollerPoll::PollerPoll() { pollfds_.resize(defaultPollSize); }